

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ListBoxFooter(void)

{
  ImGuiWindow *pIVar1;
  ImGuiStyle *pIVar2;
  ImGuiStyle *style;
  ImRect bb;
  ImGuiWindow *parent_window;
  
  pIVar1 = GetCurrentWindow();
  bb.Max = (ImVec2)pIVar1->ParentWindow;
  style = *(ImGuiStyle **)&((ImRect *)((long)bb.Max + 0x128))->Min;
  bb.Min = *(ImVec2 *)((long)bb.Max + 0x130);
  pIVar2 = GetStyle();
  EndChildFrame();
  SameLine(0.0,-1.0);
  *(ImGuiStyle **)((long)bb.Max + 0xe0) = style;
  ItemSize((ImRect *)&style,(pIVar2->FramePadding).y);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow* parent_window = GetCurrentWindow()->ParentWindow;
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}